

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nesintf.c
# Opt level: O2

void nes_set_pan_nsfplay(void *chip,INT16 *PanVals)

{
  UINT8 curChn;
  long lVar1;
  INT32 (*channels) [2];
  INT32 pan [6] [2];
  
  channels = pan;
  for (lVar1 = 0; lVar1 != 6; lVar1 = lVar1 + 1) {
    Panning_Calculate(*channels,PanVals[lVar1]);
    channels = (INT32 (*) [2])((long)channels + 8);
  }
  NES_APU_np_SetStereoMix
            (*(void **)((long)chip + 8),0,(INT16)(pan[0][0] + 0x100U >> 9),
             (INT16)(pan[0][1] + 0x100U >> 9));
  NES_APU_np_SetStereoMix
            (*(void **)((long)chip + 8),1,(INT16)(pan[1][0] + 0x100U >> 9),
             (INT16)(pan[1][1] + 0x100U >> 9));
  NES_DMC_np_SetStereoMix
            (*(void **)((long)chip + 0x10),0,(INT16)(pan[2][0] + 0x100U >> 9),
             (INT16)(pan[2][1] + 0x100U >> 9));
  NES_DMC_np_SetStereoMix
            (*(void **)((long)chip + 0x10),1,(INT16)(pan[3][0] + 0x100U >> 9),
             (INT16)(pan[3][1] + 0x100U >> 9));
  NES_DMC_np_SetStereoMix
            (*(void **)((long)chip + 0x10),2,(INT16)(pan[4][0] + 0x100U >> 9),
             (INT16)(pan[4][1] + 0x100U >> 9));
  if (*(void **)((long)chip + 0x18) != (void *)0x0) {
    NES_FDS_SetStereoMix
              (*(void **)((long)chip + 0x18),0,(INT16)(pan[5][0] + 0x100U >> 9),
               (INT16)(pan[5][1] + 0x100U >> 9));
  }
  return;
}

Assistant:

static void nes_set_pan_nsfplay(void* chip, const INT16* PanVals)
{
	NESAPU_INF* info = (NESAPU_INF*)chip;
	UINT8 curChn;
	INT32 pan[6][2];
	
	for (curChn = 0; curChn < 6; curChn++)
		Panning_Calculate(pan[curChn], PanVals[curChn]);
	
	NES_APU_np_SetStereoMix(info->chip_apu, 0, PAN_EMU2NSF(pan[0][0]), PAN_EMU2NSF(pan[0][1]));
	NES_APU_np_SetStereoMix(info->chip_apu, 1, PAN_EMU2NSF(pan[1][0]), PAN_EMU2NSF(pan[1][1]));
	NES_DMC_np_SetStereoMix(info->chip_dmc, 0, PAN_EMU2NSF(pan[2][0]), PAN_EMU2NSF(pan[2][1]));
	NES_DMC_np_SetStereoMix(info->chip_dmc, 1, PAN_EMU2NSF(pan[3][0]), PAN_EMU2NSF(pan[3][1]));
	NES_DMC_np_SetStereoMix(info->chip_dmc, 2, PAN_EMU2NSF(pan[4][0]), PAN_EMU2NSF(pan[4][1]));
#ifdef EC_NES_NSFP_FDS
	if (info->chip_fds != NULL)
		NES_FDS_SetStereoMix(info->chip_fds, 0, PAN_EMU2NSF(pan[5][0]), PAN_EMU2NSF(pan[5][1]));
#endif
	
	return;
}